

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O0

void __thiscall
boomphf::file_binary<unsigned_long>::file_binary(file_binary<unsigned_long> *this,char *filename)

{
  FILE *pFVar1;
  invalid_argument *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long *in_RDI;
  allocator *__lhs;
  allocator local_51;
  string local_50 [32];
  string local_30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_10 = in_RSI;
  pFVar1 = fopen((char *)in_RSI,"rb");
  *in_RDI = (long)pFVar1;
  if (*in_RDI == 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    __lhs = &local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,(char *)local_10,__lhs);
    std::operator+((char *)__lhs,local_10);
    std::invalid_argument::invalid_argument(this_00,local_30);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

file_binary(const char* filename)
		{
			_is = fopen(filename, "rb");

			if (!_is) {
				throw std::invalid_argument("Error opening " + std::string(filename));
			}
		}